

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

Table * wasm::ModuleUtils::copyTable(Table *table,Module *out)

{
  char *pcVar1;
  tuple<wasm::Table_*,_std::default_delete<wasm::Table>_> in_RAX;
  Table *pTVar2;
  __uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_> local_28;
  __single_object ret;
  
  local_28._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
       (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
       (tuple<wasm::Table_*,_std::default_delete<wasm::Table>_>)
       in_RAX.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
       super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
  std::make_unique<wasm::Table>();
  pcVar1 = (table->super_Importable).super_Named.name.super_IString.str._M_str;
  *(size_t *)
   local_28._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
       (table->super_Importable).super_Named.name.super_IString.str._M_len;
  *(char **)((long)local_28._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 8) = pcVar1;
  *(bool *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x10) =
       (table->super_Importable).super_Named.hasExplicitName;
  *(uintptr_t *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x48) = (table->type).id;
  pcVar1 = (table->super_Importable).module.super_IString.str._M_str;
  *(size_t *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x18) =
       (table->super_Importable).module.super_IString.str._M_len;
  *(char **)((long)local_28._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x20) = pcVar1;
  pcVar1 = (table->super_Importable).base.super_IString.str._M_str;
  *(size_t *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x28) =
       (table->super_Importable).base.super_IString.str._M_len;
  *(char **)((long)local_28._M_t.
                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                   super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x30) = pcVar1;
  *(address64_t *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x38) = (table->initial).addr;
  *(address64_t *)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x40) = (table->max).addr;
  pTVar2 = (Table *)wasm::Module::addTable((unique_ptr *)out);
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
            ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)&local_28);
  return pTVar2;
}

Assistant:

inline Table* copyTable(const Table* table, Module& out) {
  auto ret = std::make_unique<Table>();
  ret->name = table->name;
  ret->hasExplicitName = table->hasExplicitName;
  ret->type = table->type;
  ret->module = table->module;
  ret->base = table->base;

  ret->initial = table->initial;
  ret->max = table->max;

  return out.addTable(std::move(ret));
}